

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2Flt::set(V2Flt *this,syVFlt *para)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  this->mode = (int)para->mode;
  fVar2 = exp2f((para->cutoff * 0.0078125 + -1.0) * 10.0);
  fVar2 = fVar2 * this->inst->SRfclinfreq;
  fVar4 = para->reso * 0.0078125;
  if (this->mode < 6) {
    this->res = 1.0 - fVar4;
    lVar1 = 4;
  }
  else {
    fVar2 = fVar2 * 0.25;
    fVar3 = 1.0 - fVar2;
    fVar2 = fVar2 * 0.8 * fVar3 + fVar2;
    this->moogp = fVar2;
    this->moogf = (1.0 - fVar2) - fVar2;
    fVar2 = ((fVar3 * 5.6 * fVar3 + (1.0 - fVar3)) * fVar3 * 0.5 + 1.0) * fVar4 * 4.0;
    lVar1 = 0x14;
  }
  *(float *)((long)(this->moog).b + lVar1 + -0x20) = fVar2;
  return;
}

Assistant:

void set(const syVFlt *para)
    {
        mode = (int)para->mode;
        float f = calcfreq(para->cutoff / 128.0f) * inst->SRfclinfreq;
        float r = para->reso / 128.0f;

        if (mode < MOOGL)
        {
            COVER("VCF set regular");
            res = 1.0f - r;
            cfreq = f;
        }
        else
        {
            COVER("VCF set moog");

            // @@@BUG? V2 code for this part looks suspicious.
            f *= 0.25f;
            float t = 1.0f - f;

            moogp = f + 0.8f * f * t;
            moogf = 1.0f - moogp - moogp;
            moogq = 4.0f * r * (1.0f + 0.5f * t * (1.0f - t + 5.6f * t * t));
        }
    }